

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerhand_test.cpp
# Opt level: O2

Utest * __thiscall
TEST_PlayerHandTest_Kon_TestShell::createTest(TEST_PlayerHandTest_Kon_TestShell *this)

{
  TEST_PlayerHandTest_Kon_Test *this_00;
  
  this_00 = (TEST_PlayerHandTest_Kon_Test *)
            operator_new(0x60,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/playerhand_test.cpp"
                         ,0x25);
  TEST_PlayerHandTest_Kon_Test::TEST_PlayerHandTest_Kon_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(PlayerHandTest, Kon)
{
	h.add(Tile::OneOfCircles);
	h.add(Tile::OneOfCircles);
	h.add(Tile::OneOfCircles);
	h.add(Tile::OneOfCircles);

	h.bindOpenQuad({
		Tile::OneOfCircles,
		Tile::OneOfCircles,
		Tile::OneOfCircles,
		Tile::OneOfCircles
	});

	CHECK(!h.isClosedHand());
}